

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgp_fingerprints.c
# Opt level: O3

void pgp_fingerprints(void)

{
  fputs("These are the fingerprints of the PuTTY PGP Master Keys. They can\nbe used to establish a trust path from this executable to another\none. See the manual for more information.\n(Note: these fingerprints have nothing to do with SSH!)\n\nPuTTY Master Key as of 2021 (RSA, 3072-bit):\n  A872 D42F 1660 890F 0E05  223E DD43 55EA AC11 19DE\n\nPrevious Master Key (2018, RSA, 4096-bit):\n  24E1 B1C5 75EA 3C9F F752  A922 76BC 7FE4 EBFD 2D9E\n"
        ,_stdout);
  return;
}

Assistant:

void pgp_fingerprints(void)
{
    fputs("These are the fingerprints of the PuTTY PGP Master Keys. They can\n"
          "be used to establish a trust path from this executable to another\n"
          "one. See the manual for more information.\n"
          "(Note: these fingerprints have nothing to do with SSH!)\n"
          "\n"
          "PuTTY Master Key as of " PGP_MASTER_KEY_YEAR
          " (" PGP_MASTER_KEY_DETAILS "):\n"
          "  " PGP_MASTER_KEY_FP "\n\n"
          "Previous Master Key (" PGP_PREV_MASTER_KEY_YEAR
          ", " PGP_PREV_MASTER_KEY_DETAILS "):\n"
          "  " PGP_PREV_MASTER_KEY_FP "\n", stdout);
}